

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderValidateCData(xmlTextReaderPtr reader,xmlChar *data,int len)

{
  int *piVar1;
  xmlParserCtxtPtr pxVar2;
  uint uVar3;
  xmlTextReaderValidate xVar4;
  int iVar5;
  
  xVar4 = reader->validate;
  if (xVar4 == XML_TEXTREADER_VALIDATE_DTD) {
    pxVar2 = reader->ctxt;
    if (pxVar2 == (xmlParserCtxtPtr)0x0) {
      return;
    }
    if (pxVar2->validate != 1) {
      return;
    }
    uVar3 = xmlValidatePushCData(&pxVar2->vctxt,data,len);
    piVar1 = &reader->ctxt->valid;
    *piVar1 = *piVar1 & uVar3;
    xVar4 = reader->validate;
  }
  if ((((xVar4 == XML_TEXTREADER_VALIDATE_RNG) &&
       (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) &&
      (reader->rngFullNode == (xmlNodePtr)0x0)) &&
     (iVar5 = xmlRelaxNGValidatePushCData(reader->rngValidCtxt,data,len), iVar5 != 1)) {
    reader->rngValidErrors = reader->rngValidErrors + 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderValidateCData(xmlTextReaderPtr reader,
                           const xmlChar *data, int len) {
#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	reader->ctxt->valid &= xmlValidatePushCData(&reader->ctxt->vctxt,
	                                            data, len);
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) return;
	ret = xmlRelaxNGValidatePushCData(reader->rngValidCtxt, data, len);
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif
}